

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

Literal_t * Lit_Alloc(uint *pTruth,int nVars,int varIdx,char pol)

{
  byte bVar1;
  uint *pIn;
  uint *__ptr;
  uint uVar2;
  int iVar3;
  uint *pOut;
  uint *pOut_00;
  uint *pOut_01;
  uint *pOut_02;
  uint *puVar4;
  Vec_Str_t *p;
  Literal_t *pLVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint *__ptr_00;
  size_t __size;
  
  iVar3 = (int)CONCAT71(in_register_00000009,pol);
  if ((iVar3 != 0x2b) && (iVar3 != 0x2d)) {
    __assert_fail("pol == \'+\' || pol == \'-\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/rpo/literal.h"
                  ,0x88,"Literal_t *Lit_Alloc(unsigned int *, int, int, char)");
  }
  bVar1 = (char)nVars - 5U & 0x1f;
  uVar7 = 1 << bVar1;
  uVar2 = uVar7;
  if (nVars < 6) {
    uVar2 = 1;
  }
  __size = (long)(int)uVar2 << 2;
  pOut = (uint *)malloc(__size);
  pOut_00 = (uint *)malloc(__size);
  pOut_01 = (uint *)malloc(__size);
  Kit_TruthCofactor0New(pOut_00,pTruth,nVars,varIdx);
  Kit_TruthCofactor1New(pOut_01,pTruth,nVars,varIdx);
  pOut_02 = (uint *)malloc(__size);
  __ptr_00 = pOut_01;
  puVar4 = pOut_01;
  pIn = pOut_00;
  __ptr = pOut_02;
  if (pol != '+') {
    __ptr_00 = pOut_02;
    puVar4 = pOut_00;
    pIn = pOut_01;
    __ptr = pOut_01;
  }
  Kit_TruthNot(pOut_02,pIn,nVars);
  Kit_TruthAnd(pOut,pOut_02,puVar4,nVars);
  free(pOut_00);
  free(__ptr);
  free(__ptr_00);
  iVar3 = Kit_TruthIsConst0(pOut,nVars);
  if (iVar3 == 0) {
    puVar4 = (uint *)malloc(__size);
    uVar6 = 0;
    uVar8 = (ulong)uVar7;
    if (1 << bVar1 < 1) {
      uVar8 = uVar6;
    }
    if (nVars < 6) {
      uVar8 = 1;
    }
    if (varIdx < 5) {
      for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
        puVar4[uVar6] = *(uint *)(&DAT_00820d20 + (ulong)(uint)varIdx * 4);
      }
    }
    else {
      for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
        puVar4[uVar6] = -(uint)((1 << ((char)varIdx - 5U & 0x1f) & (uint)uVar6) != 0);
      }
    }
    p = Vec_StrAlloc(5);
    if (pol == '-') {
      Kit_TruthNot(puVar4,puVar4,nVars);
      Vec_StrPush(p,'!');
    }
    Vec_StrPush(p,(char)varIdx + 'a');
    Vec_StrPush(p,'\0');
    pLVar5 = (Literal_t *)malloc(0x18);
    pLVar5->function = puVar4;
    pLVar5->transition = pOut;
    pLVar5->expression = p;
  }
  else {
    free(pOut);
    pLVar5 = (Literal_t *)0x0;
  }
  return pLVar5;
}

Assistant:

static inline Literal_t* Lit_Alloc(unsigned* pTruth, int nVars, int varIdx, char pol) {
    unsigned * transition;
    unsigned * function;
    Vec_Str_t * exp;
    Literal_t* lit;
    assert(pol == '+' || pol == '-');
    transition = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    if (pol == '+') {
        Lit_TruthPositiveTransition(pTruth, transition, nVars, varIdx);
    } else {
        Lit_TruthNegativeTransition(pTruth, transition, nVars, varIdx);
    }
    if (!Kit_TruthIsConst0(transition,nVars)) {
        function = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
        Kit_TruthIthVar(function, nVars, varIdx);
        //Abc_Print(-2, "Allocating function %X %d %c \n", *function, varIdx, pol);
        exp = Vec_StrAlloc(5);
        if (pol == '-') {
            Kit_TruthNot(function, function, nVars);
            Vec_StrPutC(exp, '!');
        }
        Vec_StrPutC(exp, (char)('a' + varIdx));
        Vec_StrPutC(exp, '\0');
        lit = ABC_ALLOC(Literal_t, 1);
        lit->function = function;
        lit->transition = transition;
        lit->expression = exp;
        return lit;
    } else {
        ABC_FREE(transition); // free the function.
        return NULL;
    }
}